

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shlut.hpp
# Opt level: O1

void calculate_sh_lut(float *data,int size)

{
  float fVar1;
  ulong uVar2;
  float *pfVar3;
  int index;
  long lVar4;
  int face;
  long lVar5;
  float fVar6;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  float fVar7;
  float fVar8;
  vec3f d [6];
  float GU;
  float coeffs [225];
  float local_498 [18];
  long local_450;
  ulong local_448;
  float *local_440;
  ulong local_438;
  float *local_430;
  vec3f local_428;
  float local_418;
  float local_408;
  uint uStack_404;
  uint uStack_400;
  uint uStack_3fc;
  float local_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  float local_3b8 [226];
  
  if (0 < size) {
    local_418 = (float)size * 0.5;
    local_408 = -local_418;
    uStack_404 = in_XMM0_Db ^ 0x80000000;
    uStack_400 = in_XMM0_Dc ^ 0x80000000;
    uStack_3fc = in_XMM0_Dd ^ 0x80000000;
    uVar2 = (ulong)(uint)size;
    local_450 = uVar2 * 4;
    local_448 = 0;
    do {
      local_3f8 = ((float)(int)local_448 - local_418) + 0.5;
      local_3e8 = ZEXT416((uint)local_3f8);
      local_3f8 = -local_3f8;
      uStack_3f4 = 0x80000000;
      uStack_3f0 = 0x80000000;
      uStack_3ec = 0x80000000;
      local_438 = 0;
      local_440 = data;
      do {
        local_498[5] = ((float)(int)local_438 - local_418) + 0.5;
        local_498[0] = local_418;
        local_498[1] = local_3f8;
        local_498[2] = -local_498[5];
        local_498[3] = local_408;
        local_498[4] = local_3f8;
        local_498[6] = local_498[5];
        local_498[7] = local_418;
        local_498[8] = (float)local_3e8._0_4_;
        local_498[9] = local_498[5];
        local_498[10] = local_408;
        local_498[0xb] = local_3f8;
        local_498[0xc] = local_498[5];
        local_498[0xd] = local_3f8;
        local_498[0xe] = local_418;
        local_498[0xf] = -local_498[5];
        local_498[0x10] = local_3f8;
        local_498[0x11] = local_408;
        lVar5 = 0;
        local_430 = data;
        do {
          fVar7 = local_498[lVar5 * 3];
          fVar8 = local_498[lVar5 * 3 + 1];
          fVar1 = local_498[lVar5 * 3 + 2];
          fVar6 = fVar1 * fVar1 + fVar7 * fVar7 + fVar8 * fVar8;
          if (fVar6 < 0.0) {
            local_3c8 = ZEXT416((uint)fVar7);
            local_3d8 = ZEXT416((uint)fVar8);
            fVar6 = sqrtf(fVar6);
            fVar7 = (float)local_3c8._0_4_;
            fVar8 = (float)local_3d8._0_4_;
          }
          else {
            fVar6 = SQRT(fVar6);
          }
          fVar6 = 1.0 / fVar6;
          local_428.z = fVar1 * fVar6;
          local_428.y = fVar8 * fVar6;
          local_428.x = fVar7 * fVar6;
          SHEvaluate(&local_428,0xe,local_3b8);
          lVar4 = 0;
          pfVar3 = data;
          do {
            *pfVar3 = local_3b8[lVar4];
            lVar4 = lVar4 + 1;
            pfVar3 = pfVar3 + uVar2 * uVar2 * 6;
          } while (lVar4 != 0xe1);
          lVar5 = lVar5 + 1;
          data = data + uVar2 * uVar2;
        } while (lVar5 != 6);
        local_438 = local_438 + 1;
        data = local_430 + 1;
      } while (local_438 != uVar2);
      local_448 = local_448 + 1;
      data = (float *)((long)local_440 + local_450);
    } while (local_448 != uVar2);
  }
  return;
}

Assistant:

void calculate_sh_lut(float* data, const int size)
// layout: SHindex, face, position, rgb
{
	// evaluate SH bases at different direction N
	for (int i = 0; i < size; i++)
	{
		for (int j = 0; j < size; j++)
		{
			float GU = size*0.5f;
			float u = (float)j - GU + 0.5f;
			float v = (float)i - GU + 0.5f;
			// corresponding direction on each face
			vec3f d[6] = {
				vec3f( GU,  -v,  -u),
				vec3f(-GU,  -v,   u),
				vec3f(  u,  GU,   v),
				vec3f(  u, -GU,  -v),
				vec3f(  u,  -v,  GU),
				vec3f( -u,  -v, -GU)
			};
			for (int face = 0; face < 6; face++)
			{
				float coeffs[N_COEFFS];
				vec3f N = normalized(d[face]);
				SHEvaluate(N, shorder-1, coeffs);
				// fill in data
				for(int index=0; index < N_COEFFS; ++index) {
					data[((index*6 + face) * size + i) * size + j] = coeffs[index];
				}
			}
		}
	}
}